

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heter_queue.h
# Opt level: O0

void __thiscall
density::
heter_queue<density::runtime_type<density::feature_list<density::f_size,_density::f_alignment,_density::f_copy_construct,_density::f_move_construct,_density::f_rtti,_density::f_destroy>,_density::f_ostream>,_density::basic_default_allocator<65536UL>_>
::clean_dead_elements
          (heter_queue<density::runtime_type<density::feature_list<density::f_size,_density::f_alignment,_density::f_copy_construct,_density::f_move_construct,_density::f_rtti,_density::f_destroy>,_density::f_ostream>,_density::basic_default_allocator<65536UL>_>
           *this)

{
  bool bVar1;
  ControlBlock *i_first;
  undefined8 *puVar2;
  ExternalBlock *block;
  void *result;
  ControlBlock *next;
  ControlBlock *curr;
  heter_queue<density::runtime_type<density::feature_list<density::f_size,_density::f_alignment,_density::f_copy_construct,_density::f_move_construct,_density::f_rtti,_density::f_destroy>,_density::f_ostream>,_density::basic_default_allocator<65536UL>_>
  *this_local;
  
  i_first = this->m_head;
  while ((next = i_first, next != this->m_tail && ((next->m_next & 3) == 2))) {
    i_first = (ControlBlock *)(next->m_next & 0xfffffffffffffff8);
    if ((next->m_next & 4) != 0) {
      puVar2 = (undefined8 *)address_add(next,0x10);
      basic_default_allocator<65536UL>::deallocate
                ((basic_default_allocator<65536UL> *)this,(void *)*puVar2,puVar2[1],puVar2[2],0);
    }
    bVar1 = same_page(i_first,next);
    if (!bVar1) {
      basic_default_allocator<65536UL>::deallocate_page
                ((basic_default_allocator<65536UL> *)this,next);
    }
  }
  if ((next != this->m_tail) && ((next->m_next & 3) == 2)) {
    density_tests::detail::assert_failed<>
              ("curr == m_tail || (curr->m_next & (detail::Queue_Busy | detail::Queue_Dead)) != detail::Queue_Dead"
               ,anon_var_dwarf_12e55,0xb88);
  }
  this->m_head = next;
  return;
}

Assistant:

void clean_dead_elements() noexcept
        {
            auto curr = m_head;
            while (curr != m_tail)
            {
                // break if the current block is busy or is not dead
                if (
                  (curr->m_next & (detail::Queue_Busy | detail::Queue_Dead)) != detail::Queue_Dead)
                {
                    break;
                }

                auto next =
                  reinterpret_cast<ControlBlock *>(curr->m_next & ~detail::Queue_AllFlags);
                if (curr->m_next & detail::Queue_External)
                {
                    auto result = address_add(curr, s_sizeof_ControlBlock + s_sizeof_RuntimeType);
                    const auto & block = *static_cast<ExternalBlock *>(result);
                    ALLOCATOR_TYPE::deallocate(block.m_element, block.m_size, block.m_alignment);
                }

                if (!same_page(next, curr))
                {
                    allocator_type::deallocate_page(curr);
                }

                curr = next;
            }

            DENSITY_ASSERT_INTERNAL(
              curr == m_tail ||
              (curr->m_next & (detail::Queue_Busy | detail::Queue_Dead)) != detail::Queue_Dead);
            m_head = curr;
        }